

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_mul_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_uint b)

{
  bool bVar1;
  int local_34;
  ulong uStack_30;
  int ret;
  size_t n;
  mbedtls_mpi_uint b_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  uStack_30 = (ulong)A->n;
  while( true ) {
    bVar1 = false;
    if (uStack_30 != 0) {
      bVar1 = A->p[uStack_30 - 1] == 0;
    }
    if (!bVar1) break;
    uStack_30 = uStack_30 - 1;
  }
  if ((b == 0) || (uStack_30 == 0)) {
    X_local._4_4_ = mbedtls_mpi_lset(X,0);
  }
  else {
    local_34 = mbedtls_mpi_grow(X,uStack_30 + 1);
    if ((local_34 == 0) && (local_34 = mbedtls_mpi_copy(X,A), local_34 == 0)) {
      mbedtls_mpi_core_mla(X->p,(ulong)X->n,A->p,uStack_30,b - 1);
    }
    X_local._4_4_ = local_34;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_mul_int(mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_uint b)
{
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);

    size_t n = A->n;
    while (n > 0 && A->p[n - 1] == 0) {
        --n;
    }

    /* The general method below doesn't work if b==0. */
    if (b == 0 || n == 0) {
        return mbedtls_mpi_lset(X, 0);
    }

    /* Calculate A*b as A + A*(b-1) to take advantage of mbedtls_mpi_core_mla */
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    /* In general, A * b requires 1 limb more than b. If
     * A->p[n - 1] * b / b == A->p[n - 1], then A * b fits in the same
     * number of limbs as A and the call to grow() is not required since
     * copy() will take care of the growth if needed. However, experimentally,
     * making the call to grow() unconditional causes slightly fewer
     * calls to calloc() in ECP code, presumably because it reuses the
     * same mpi for a while and this way the mpi is more likely to directly
     * grow to its final size.
     *
     * Note that calculating A*b as 0 + A*b doesn't work as-is because
     * A,X can be the same. */
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n + 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, A));
    mbedtls_mpi_core_mla(X->p, X->n, A->p, n, b - 1);

cleanup:
    return ret;
}